

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::RuntimeCharSet<char16_t>::Get_helper(RuntimeCharSet<char16_t> *this,uint k)

{
  CharSetNode *pCVar1;
  byte bVar2;
  CharSetNode *pCVar3;
  CharSetNode *pCVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  
  bVar7 = this->root == (CharSetNode *)&CharSetFull::Instance;
  if (bVar7) {
    bVar6 = false;
    pCVar3 = (CharSetNode *)&CharSetFull::Instance;
  }
  else {
    bVar2 = 0xc;
    uVar5 = 3;
    bVar6 = false;
    pCVar4 = this->root;
    do {
      pCVar1 = (CharSetNode *)pCVar4[(ulong)(k >> (bVar2 & 0x1f) & 0xf) + 1]._vptr_CharSetNode;
      pCVar3 = pCVar4;
      if (pCVar1 == (CharSetNode *)0x0) break;
      uVar5 = uVar5 - 1;
      bVar6 = uVar5 < 2;
      pCVar3 = pCVar1;
      if (bVar6) break;
      bVar2 = bVar2 - 4;
      bVar7 = pCVar1 == (CharSetNode *)&CharSetFull::Instance;
      pCVar3 = (CharSetNode *)&CharSetFull::Instance;
      pCVar4 = pCVar1;
    } while (!bVar7);
  }
  if (bVar6) {
    if (pCVar3 == (CharSetNode *)&CharSetFull::Instance) {
      bVar7 = true;
    }
    else {
      bVar7 = (*(uint *)((long)&pCVar3[1]._vptr_CharSetNode + (ulong)(k >> 3 & 0x1c)) >> (k & 0x1f)
              & 1) != 0;
    }
  }
  return bVar7;
}

Assistant:

bool RuntimeCharSet<char16>::Get_helper(uint k) const
    {
        CharSetNode* curr = root;
        for (int level = CharSetNode::levels - 1; level > 0; level--)
        {
            if (curr == CharSetFull::TheFullNode)
                return true;
            CharSetInner* inner = (CharSetInner*)curr;
            uint i = CharSetNode::innerIdx(level, k);
            if (inner->children[i] == 0)
                return false;
            else
                curr = inner->children[i];
        }
        if (curr == CharSetFull::TheFullNode)
            return true;
        CharSetLeaf* leaf = (CharSetLeaf*)curr;
        return leaf->vec.Get(CharSetNode::leafIdx(k));
    }